

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O1

interpolator * interp_create(uint taps,uint factor,uint channels)

{
  ulong __nmemb;
  uint uVar1;
  interpolator *__ptr;
  interp_filter *__ptr_00;
  uint *puVar2;
  double *pdVar3;
  float **__ptr_01;
  float *pfVar4;
  uint uVar5;
  int iVar6;
  double **ppdVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  __ptr = (interpolator *)calloc(1,0x28);
  if (__ptr != (interpolator *)0x0) {
    __ptr->taps = 0x31;
    __ptr->factor = taps;
    __ptr->channels = factor;
    uVar10 = (ulong)(taps + 0x30) / (ulong)taps;
    __ptr->delay = (uint)uVar10;
    __ptr_00 = (interp_filter *)calloc((ulong)taps,0x18);
    __ptr->filter = __ptr_00;
    if (__ptr_00 != (interp_filter *)0x0) {
      uVar1 = taps + (taps == 0);
      ppdVar7 = &__ptr_00->coeff;
      uVar5 = uVar1;
      do {
        puVar2 = (uint *)calloc(uVar10,4);
        ppdVar7[-1] = (double *)puVar2;
        pdVar3 = (double *)calloc(uVar10,8);
        *ppdVar7 = pdVar3;
        if ((ppdVar7[-1] == (double *)0x0) || (*ppdVar7 == (double *)0x0)) goto LAB_00108140;
        ppdVar7 = ppdVar7 + 3;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      __nmemb = (ulong)factor;
      __ptr_01 = (float **)calloc(__nmemb,8);
      __ptr->z = __ptr_01;
      if (__ptr_01 != (float **)0x0) {
        if (factor == 0) {
LAB_0010800b:
          dVar13 = 0.0;
          iVar6 = -0x18;
          do {
            dVar11 = 1.0;
            if (1e-06 < ABS((double)iVar6)) {
              dVar12 = ((double)iVar6 * 3.141592653589793) / (double)taps;
              dVar11 = sin(dVar12);
              dVar11 = dVar11 / dVar12;
            }
            dVar12 = cos((dVar13 * 6.283185307179586) / 48.0);
            dVar11 = (1.0 - dVar12) * 0.5 * dVar11;
            if (1e-06 < ABS(dVar11)) {
              uVar10 = (ulong)(iVar6 + 0x18U) % (ulong)taps;
              uVar5 = __ptr_00[uVar10].count;
              __ptr_00[uVar10].count = uVar5 + 1;
              __ptr_00[uVar10].coeff[uVar5] = dVar11;
              __ptr_00[uVar10].index[uVar5] = (iVar6 + 0x18U) / taps;
            }
            dVar13 = dVar13 + 1.0;
            iVar6 = iVar6 + 1;
          } while (iVar6 != 0x19);
          return __ptr;
        }
        uVar8 = 0;
LAB_00107fe7:
        pfVar4 = (float *)calloc(uVar10,4);
        __ptr_01[uVar8] = pfVar4;
        if (pfVar4 != (float *)0x0) goto code_r0x00108002;
        uVar10 = 0;
        do {
          free(__ptr_01[uVar10]);
          uVar10 = uVar10 + 1;
        } while (__nmemb != uVar10);
        free(__ptr_01);
      }
LAB_00108140:
      lVar9 = 0;
      do {
        free(*(void **)((long)&__ptr_00->index + lVar9));
        free(*(void **)((long)&__ptr_00->coeff + lVar9));
        lVar9 = lVar9 + 0x18;
      } while ((ulong)uVar1 * 0x18 != lVar9);
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (interpolator *)0x0;
code_r0x00108002:
  uVar8 = uVar8 + 1;
  if (__nmemb == uVar8) goto LAB_0010800b;
  goto LAB_00107fe7;
}

Assistant:

static interpolator*
interp_create(unsigned int taps, unsigned int factor, unsigned int channels) {
  int errcode; /* unused */
  interpolator* interp;
  unsigned int j;

  interp = (interpolator*) calloc(1, sizeof(interpolator));
  CHECK_ERROR(!interp, 0, exit);

  interp->taps = taps;
  interp->factor = factor;
  interp->channels = channels;
  interp->delay = (interp->taps + interp->factor - 1) / interp->factor;

  /* Initialize the filter memory
   * One subfilter per interpolation factor. */
  interp->filter =
      (interp_filter*) calloc(interp->factor, sizeof(*interp->filter));
  CHECK_ERROR(!interp->filter, 0, free_interp);

  for (j = 0; j < interp->factor; j++) {
    interp->filter[j].index =
        (unsigned int*) calloc(interp->delay, sizeof(unsigned int));
    interp->filter[j].coeff = (double*) calloc(interp->delay, sizeof(double));
    CHECK_ERROR(!interp->filter[j].index || !interp->filter[j].coeff, 0,
                free_filter_index_coeff);
  }

  /* One delay buffer per channel. */
  interp->z = (float**) calloc(interp->channels, sizeof(float*));
  CHECK_ERROR(!interp->z, 0, free_filter_index_coeff);
  for (j = 0; j < interp->channels; j++) {
    interp->z[j] = (float*) calloc(interp->delay, sizeof(float));
    CHECK_ERROR(!interp->z[j], 0, free_filter_z);
  }

  /* Calculate the filter coefficients */
  for (j = 0; j < interp->taps; j++) {
    /* Calculate sinc */
    double m = (double) j - (double) (interp->taps - 1) / 2.0;
    double c = 1.0;
    if (fabs(m) > ALMOST_ZERO) {
      c = sin(m * M_PI / interp->factor) / (m * M_PI / interp->factor);
    }
    /* Apply Hanning window */
    c *= 0.5 * (1 - cos(2 * M_PI * j / (interp->taps - 1)));

    if (fabs(c) > ALMOST_ZERO) { /* Ignore any zero coeffs. */
      /* Put the coefficient into the correct subfilter */
      unsigned int f = j % interp->factor;
      unsigned int t = interp->filter[f].count++;
      interp->filter[f].coeff[t] = c;
      interp->filter[f].index[t] = j / interp->factor;
    }
  }
  return interp;

free_filter_z:
  for (j = 0; j < interp->channels; j++) {
    free(interp->z[j]);
  }
  free(interp->z);
free_filter_index_coeff:
  for (j = 0; j < interp->factor; j++) {
    free(interp->filter[j].index);
    free(interp->filter[j].coeff);
  }
  free(interp->filter);
free_interp:
  free(interp);
exit:
  return NULL;
}